

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O3

int hmode(CPURISCVState_conflict2 *env,int csrno)

{
  _Bool _Var1;
  int iVar2;
  target_ulong tVar3;
  
  if ((~(uint)env->misa & 0x40080) == 0) {
    tVar3 = env->priv;
    if (tVar3 == 1) {
      _Var1 = riscv_cpu_virt_enabled_riscv64((CPURISCVState_conflict1 *)env);
      if (_Var1) {
        tVar3 = env->priv;
        goto LAB_00c68210;
      }
    }
    else {
LAB_00c68210:
      if (tVar3 != 3) goto LAB_00c6821a;
    }
    iVar2 = 0;
  }
  else {
LAB_00c6821a:
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

static int hmode(CPURISCVState *env, int csrno)
{
    if (riscv_has_ext(env, RVS) &&
        riscv_has_ext(env, RVH)) {
        /* Hypervisor extension is supported */
        if ((env->priv == PRV_S && !riscv_cpu_virt_enabled(env)) ||
            env->priv == PRV_M) {
            return 0;
        }
    }

    return -1;
}